

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_flt3_arith(DisasContext_conflict6 *ctx,uint32_t opc,int fd,int fr,int fs,int ft)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 t;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 t_00;
  uintptr_t o;
  code *pcVar7;
  uintptr_t o_1;
  TCGTemp *ts;
  uintptr_t o_5;
  uintptr_t o_2;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i32 local_48;
  TCGLabel *local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  switch(opc) {
  case 0x4c00001e:
    check_ps(ctx);
    pTVar3 = tcg_temp_local_new_i64(tcg_ctx);
    local_48 = tcg_temp_new_i32(tcg_ctx);
    local_38 = tcg_temp_new_i32(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    local_40 = l;
    l_00 = gen_new_label_mips64el(tcg_ctx);
    gen_load_gpr(tcg_ctx,pTVar3,fr);
    tcg_gen_andi_i64_mips64el(tcg_ctx,pTVar3,pTVar3,7);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,pTVar3,0,l);
    pTVar5 = local_48;
    gen_load_fpr32(ctx,local_48,fs);
    pTVar6 = local_38;
    gen_load_fpr32h(ctx,local_38,fs);
    gen_store_fpr32(ctx,pTVar5,fd);
    gen_store_fpr32h(ctx,pTVar6,fd);
    tcg_gen_br(tcg_ctx,l_00);
    gen_set_label(tcg_ctx,local_40);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,pTVar3,4,l_00);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    gen_load_fpr32h(ctx,pTVar6,fs);
    pTVar5 = local_48;
    gen_load_fpr32(ctx,local_48,ft);
    gen_store_fpr32(ctx,pTVar6,fd);
    gen_store_fpr32h(ctx,pTVar5,fd);
    gen_set_label(tcg_ctx,l_00);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    return;
  case 0x4c00001f:
  case 0x4c000022:
  case 0x4c000023:
  case 0x4c000024:
  case 0x4c000025:
  case 0x4c000027:
  case 0x4c00002a:
  case 0x4c00002b:
  case 0x4c00002c:
  case 0x4c00002d:
  case 0x4c00002f:
  case 0x4c000032:
  case 0x4c000033:
  case 0x4c000034:
  case 0x4c000035:
  case 0x4c000037:
switchD_00887239_caseD_4c00001f:
    generate_exception_end(ctx,0x14);
    return;
  case 0x4c000020:
    check_cop1x(ctx);
    pTVar5 = tcg_temp_new_i32(tcg_ctx);
    pTVar6 = tcg_temp_new_i32(tcg_ctx);
    t_00 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,pTVar5,fs);
    gen_load_fpr32(ctx,pTVar6,ft);
    gen_load_fpr32(ctx,t_00,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_madd_s_mips64el;
    goto LAB_00887a4b;
  case 0x4c000021:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fs | ft | fr | fd);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_madd_d_mips64el;
    break;
  case 0x4c000026:
    check_ps(ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_madd_ps_mips64el;
    break;
  case 0x4c000028:
    check_cop1x(ctx);
    pTVar5 = tcg_temp_new_i32(tcg_ctx);
    pTVar6 = tcg_temp_new_i32(tcg_ctx);
    t_00 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,pTVar5,fs);
    gen_load_fpr32(ctx,pTVar6,ft);
    gen_load_fpr32(ctx,t_00,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_msub_s_mips64el;
    goto LAB_00887a4b;
  case 0x4c000029:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fs | ft | fr | fd);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_msub_d_mips64el;
    break;
  case 0x4c00002e:
    check_ps(ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_msub_ps_mips64el;
    break;
  case 0x4c000030:
    check_cop1x(ctx);
    pTVar5 = tcg_temp_new_i32(tcg_ctx);
    pTVar6 = tcg_temp_new_i32(tcg_ctx);
    t_00 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,pTVar5,fs);
    gen_load_fpr32(ctx,pTVar6,ft);
    gen_load_fpr32(ctx,t_00,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmadd_s_mips64el;
    goto LAB_00887a4b;
  case 0x4c000031:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fs | ft | fr | fd);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmadd_d_mips64el;
    break;
  case 0x4c000036:
    check_ps(ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmadd_ps_mips64el;
    break;
  case 0x4c000038:
    check_cop1x(ctx);
    pTVar5 = tcg_temp_new_i32(tcg_ctx);
    pTVar6 = tcg_temp_new_i32(tcg_ctx);
    t_00 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,pTVar5,fs);
    gen_load_fpr32(ctx,pTVar6,ft);
    gen_load_fpr32(ctx,t_00,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmsub_s_mips64el;
LAB_00887a4b:
    ts = local_50;
    pTVar2 = local_58;
    pTVar1 = local_60;
    tcg_gen_callN_mips64el(tcg_ctx,pcVar7,local_50,4,&local_68);
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar1);
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar2);
    gen_store_fpr32(ctx,t_00,fd);
    goto LAB_00887b3e;
  case 0x4c000039:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fs | ft | fr | fd);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmsub_d_mips64el;
    break;
  default:
    if (opc != 0x4c00003e) goto switchD_00887239_caseD_4c00001f;
    check_ps(ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    t = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx,pTVar3,fs);
    gen_load_fpr64(ctx,pTVar4,ft);
    gen_load_fpr64(ctx,t,fr);
    local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    pcVar7 = helper_float_nmsub_ps_mips64el;
  }
  ts = local_50;
  pTVar2 = local_58;
  pTVar1 = local_60;
  tcg_gen_callN_mips64el(tcg_ctx,pcVar7,local_50,4,&local_68);
  tcg_temp_free_internal_mips64el(tcg_ctx,pTVar1);
  tcg_temp_free_internal_mips64el(tcg_ctx,pTVar2);
  gen_store_fpr64(ctx,t,fd);
LAB_00887b3e:
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_flt3_arith(DisasContext *ctx, uint32_t opc,
                           int fd, int fr, int fs, int ft)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    switch (opc) {
    case OPC_ALNV_PS:
        check_ps(ctx);
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv_i32 fp = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fph = tcg_temp_new_i32(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, fr);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x7);

            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 0, l1);
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, fs);
            gen_store_fpr32(ctx, fp, fd);
            gen_store_fpr32h(ctx, fph, fd);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 4, l2);
            tcg_temp_free(tcg_ctx, t0);
#ifdef TARGET_WORDS_BIGENDIAN
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, ft);
            gen_store_fpr32h(ctx, fp, fd);
            gen_store_fpr32(ctx, fph, fd);
#else
            gen_load_fpr32h(ctx, fph, fs);
            gen_load_fpr32(ctx, fp, ft);
            gen_store_fpr32(ctx, fph, fd);
            gen_store_fpr32h(ctx, fp, fd);
#endif
            gen_set_label(tcg_ctx, l2);
            tcg_temp_free_i32(tcg_ctx, fp);
            tcg_temp_free_i32(tcg_ctx, fph);
        }
        break;
    case OPC_MADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_madd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_msub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmadd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmsub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    default:
        MIPS_INVAL("flt3_arith");
        generate_exception_end(ctx, EXCP_RI);
        return;
    }
}